

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_29(QPDF *pdf,char *arg2)

{
  element_type *peVar1;
  ostream *poVar2;
  logic_error *e_2;
  string local_200 [32];
  undefined1 local_1e0 [8];
  QPDFObjectHandle root2;
  QPDFObjectHandle root1;
  logic_error *e_1;
  QPDFWriter w_1;
  shared_ptr<QPDF> local_1a8;
  allocator<char> local_191;
  string local_190 [32];
  QPDFObjectHandle local_170;
  QPDFObjectHandle local_160;
  allocator<char> local_149;
  string local_148 [32];
  QPDFObjectHandle local_128;
  undefined1 local_118 [8];
  shared_ptr<QPDF> other2;
  logic_error *e;
  QPDFWriter w;
  allocator<char> local_e9;
  string local_e8 [32];
  QPDFObjectHandle local_c8;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle dict;
  undefined1 local_28 [8];
  shared_ptr<QPDF> other;
  char *arg2_local;
  QPDF *pdf_local;
  
  other.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  if (arg2 != (char *)0x0) {
    QPDF::create();
    peVar1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    QPDF::processFile((char *)peVar1,
                      (char *)other.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi);
    QPDFObjectHandle::newDictionary();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,"/QTest",&local_69);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"/QTest",&local_b1);
    QPDFObjectHandle::getKey((string *)&local_80);
    QPDFObjectHandle::replaceKey((string *)local_48,(QPDFObjectHandle *)local_68);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_28);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"/QTest",&local_e9);
    QPDFObjectHandle::replaceKey((string *)&local_c8,(QPDFObjectHandle *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
    peVar1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    QPDFWriter::QPDFWriter((QPDFWriter *)&e,peVar1,"a.pdf");
    QPDFWriter::write();
    poVar2 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
    QPDF::create();
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_118);
    QPDF::emptyPDF();
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_48,&local_128);
    QPDFObjectHandle::~QPDFObjectHandle(&local_128);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_148,"/QTest",&local_149);
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_118);
    QPDF::getRoot();
    QPDFObjectHandle::replaceKey((string *)local_48,(QPDFObjectHandle *)local_148);
    QPDFObjectHandle::~QPDFObjectHandle(&local_160);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_28);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_190,"/QTest",&local_191);
    QPDFObjectHandle::replaceKey((string *)&local_170,(QPDFObjectHandle *)local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    QPDFObjectHandle::~QPDFObjectHandle(&local_170);
    std::shared_ptr<QPDF>::shared_ptr(&local_1a8,(nullptr_t)0x0);
    std::shared_ptr<QPDF>::operator=((shared_ptr<QPDF> *)local_118,&local_1a8);
    std::shared_ptr<QPDF>::~shared_ptr(&local_1a8);
    peVar1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    QPDFWriter::QPDFWriter((QPDFWriter *)&e_1,peVar1,"a.pdf");
    QPDFWriter::write();
    poVar2 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    QPDFWriter::~QPDFWriter((QPDFWriter *)&e_1);
    QPDF::getRoot();
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_28);
    QPDF::getRoot();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_200,"/Oops",(allocator<char> *)((long)&e_2 + 7));
    QPDFObjectHandle::replaceKey
              ((string *)
               &root2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (QPDFObjectHandle *)local_200);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1e0);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &root2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<QPDF>::~shared_ptr((shared_ptr<QPDF> *)local_118);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
    std::shared_ptr<QPDF>::~shared_ptr((shared_ptr<QPDF> *)local_28);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x449,"void test_29(QPDF &, const char *)");
}

Assistant:

static void
test_29(QPDF& pdf, char const* arg2)
{
    // Detect mixed objects in QPDFWriter
    assert(arg2 != nullptr);
    auto other = QPDF::create();
    other->processFile(arg2);
    // We need to create a QPDF with mixed ownership to exercise
    // QPDFWriter's ownership check. To do this, we have to sneak the
    // foreign object inside an ownerless direct object to avoid
    // detection prior to calling QPDFWriter. Maybe a future version
    // of qpdf will be able prevent creating mixed ownership. Another
    // way to fake it out would be to call setDescription to
    // explicitly change the ownership to the wrong value.
    auto dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", pdf.getTrailer().getKey("/QTest"));
    other->getTrailer().replaceKey("/QTest", dict);

    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Make sure deleting the other source doesn't prevent detection.
    auto other2 = QPDF::create();
    other2->emptyPDF();
    dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", other2->getRoot());
    other->getTrailer().replaceKey("/QTest", dict);
    other2 = nullptr;
    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Detect adding a foreign object
    auto root1 = pdf.getRoot();
    auto root2 = other->getRoot();
    try {
        root1.replaceKey("/Oops", root2);
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}